

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_curve.cpp
# Opt level: O2

bool __thiscall ON_CurveArray::Read(ON_CurveArray *this,ON_BinaryArchive *file)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  ON_Curve *pOVar4;
  long lVar5;
  int count;
  int flag;
  int major_version;
  ON_Object *p;
  ON__UINT32 tcode;
  int minor_version;
  ON__INT64 big_value;
  int local_54;
  ON__INT32 local_50;
  int local_4c;
  ON_Object *local_48;
  uint local_40 [2];
  ON__INT64 local_38;
  
  local_4c = 0;
  local_40[1] = 0;
  local_40[0] = 0;
  local_38 = 0;
  Destroy(this);
  bVar1 = ON_BinaryArchive::BeginRead3dmBigChunk(file,local_40,&local_38);
  if (!bVar1) {
    return false;
  }
  if (local_40[0] == 0x40008000) {
    bVar2 = ON_BinaryArchive::Read3dmChunkVersion(file,&local_4c,(int *)(local_40 + 1));
    bVar1 = false;
    if ((!bVar2) || (bVar1 = false, local_4c != 1)) goto LAB_0044e547;
    bVar1 = ON_BinaryArchive::ReadInt(file,&local_54);
    if (bVar1) {
      ON_SimpleArray<ON_Curve_*>::SetCapacity
                (&this->super_ON_SimpleArray<ON_Curve_*>,(long)local_54);
      if ((-1 < local_54) && (local_54 <= (this->super_ON_SimpleArray<ON_Curve_*>).m_capacity)) {
        (this->super_ON_SimpleArray<ON_Curve_*>).m_count = local_54;
      }
      ON_SimpleArray<ON_Curve_*>::Zero(&this->super_ON_SimpleArray<ON_Curve_*>);
      bVar1 = true;
      for (lVar5 = 0; (bVar1 != false && (lVar5 < local_54)); lVar5 = lVar5 + 1) {
        local_50 = 0;
        bVar1 = ON_BinaryArchive::ReadInt(file,&local_50);
        if ((bVar1) && (local_50 == 1)) {
          local_48 = (ON_Object *)0x0;
          iVar3 = ON_BinaryArchive::ReadObject(file,&local_48);
          bVar1 = iVar3 != 0;
          pOVar4 = ON_Curve::Cast(local_48);
          (this->super_ON_SimpleArray<ON_Curve_*>).m_a[lVar5] = pOVar4;
          if (((this->super_ON_SimpleArray<ON_Curve_*>).m_a[lVar5] == (ON_Curve *)0x0) &&
             (local_48 != (ON_Object *)0x0)) {
            (*local_48->_vptr_ON_Object[4])();
          }
        }
      }
      goto LAB_0044e547;
    }
  }
  bVar1 = false;
LAB_0044e547:
  bVar2 = ON_BinaryArchive::EndRead3dmChunk(file);
  return (bool)(bVar2 & bVar1);
}

Assistant:

bool ON_CurveArray::Read( ON_BinaryArchive& file )
{
  int major_version = 0;
  int minor_version = 0;
  ON__UINT32 tcode = 0;
  ON__INT64 big_value = 0;
  int flag;
  Destroy();
  bool rc = file.BeginRead3dmBigChunk( &tcode, &big_value );
  if (rc) 
  {
    rc = ( tcode == TCODE_ANONYMOUS_CHUNK );
    if (rc) rc = file.Read3dmChunkVersion(&major_version,&minor_version);
    if (rc && major_version == 1) 
    {
      ON_Object* p;
      int count;
      rc = file.ReadInt( &count );
      if (rc) 
      {
        SetCapacity(count);
        SetCount(count);
        Zero();
        int i;
        for ( i = 0; rc && i < count && rc; i++ ) 
        {
          flag = 0;
          rc = file.ReadInt(&flag);
          if (rc && flag==1) 
          {
            p = 0;
            rc = file.ReadObject( &p ) ? true : false; // polymorphic curves
            m_a[i] = ON_Curve::Cast(p);
            if ( !m_a[i] )
              delete p;
          }
        }
      }
    }
    else 
    {
      rc = false;
    }
    if ( !file.EndRead3dmChunk() )
    {
      rc = false;
    }
  }
  return rc;
}